

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraInd.c
# Opt level: O2

Aig_Man_t * Fra_FraigInduction(Aig_Man_t *pManAig,Fra_Ssw_t *pParams)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  abctime aVar11;
  abctime aVar12;
  Aig_Man_t *pAVar13;
  Fra_Man_t *p;
  Fra_Sml_t *pFVar14;
  Vec_Int_t *pVVar15;
  abctime aVar16;
  abctime aVar17;
  Cnf_Dat_t *p_00;
  sat_solver *psVar18;
  void *pvVar19;
  char *pFileName;
  Aig_Man_t *pMan;
  uint uVar20;
  Fra_Man_t *pFVar21;
  Fra_Cla_t *pFVar22;
  long local_c0;
  Fra_Par_t Pars;
  
  aVar11 = Abc_Clock();
  fVar1 = pParams->TimeLimit;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    aVar12 = Abc_Clock();
    local_c0 = (long)(fVar1 * 1e+06 + (float)aVar12);
  }
  else {
    local_c0 = 0;
  }
  if (pManAig->nObjs[6] + pManAig->nObjs[5] == 0) {
    pParams->nIters = 0;
    Aig_ManReprStart(pManAig,pManAig->vObjs->nSize);
    pAVar13 = Aig_ManDupOrdered(pManAig);
    return pAVar13;
  }
  if (pManAig->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(pManAig) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                  ,0x174,"Aig_Man_t *Fra_FraigInduction(Aig_Man_t *, Fra_Ssw_t *)");
  }
  if (pParams->nFramesK < 1) {
    __assert_fail("pParams->nFramesK > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                  ,0x175,"Aig_Man_t *Fra_FraigInduction(Aig_Man_t *, Fra_Ssw_t *)");
  }
  if (pParams->fWriteImps == 0) {
LAB_004fcc04:
    if ((0 < pParams->nPartSize) && (pParams->nPartSize < pManAig->nRegs)) goto LAB_004fcc22;
  }
  else if (0 < pParams->nPartSize) {
    pParams->nPartSize = 0;
    puts("Partitioning was disabled to allow implication writing.");
    goto LAB_004fcc04;
  }
  if ((pManAig->vClockDoms != (Vec_Vec_t *)0x0) && (0 < pManAig->vClockDoms->nSize)) {
LAB_004fcc22:
    pAVar13 = Fra_FraigInductionPart(pManAig,pParams);
    return pAVar13;
  }
  iVar10 = pManAig->nRegs;
  iVar6 = pManAig->nObjs[6];
  iVar7 = pManAig->nObjs[5];
  Fra_ParamsDefaultSeq(&Pars);
  Pars.nFramesP = pParams->nFramesP;
  Pars.nFramesK = pParams->nFramesK;
  Pars.nMaxImps = pParams->nMaxImps;
  Pars.nMaxLevs = pParams->nMaxLevs;
  Pars.fVerbose = pParams->fVerbose;
  Pars.fRewrite = pParams->fRewrite;
  Pars.fLatchCorr = pParams->fLatchCorr;
  Pars.fUseImps = pParams->fUseImps;
  Pars.fWriteImps = pParams->fWriteImps;
  Pars.fUse1Hot = pParams->fUse1Hot;
  if (Pars.fUse1Hot != 0 && 0 < pParams->nFramesP) {
    __assert_fail("!(pPars->nFramesP > 0 && pPars->fUse1Hot)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                  ,0x195,"Aig_Man_t *Fra_FraigInduction(Aig_Man_t *, Fra_Ssw_t *)");
  }
  if (1 < Pars.nFramesK && Pars.fUse1Hot != 0) {
    __assert_fail("!(pPars->nFramesK > 1 && pPars->fUse1Hot)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                  ,0x196,"Aig_Man_t *Fra_FraigInduction(Aig_Man_t *, Fra_Ssw_t *)");
  }
  p = Fra_ManStart(pManAig,&Pars);
  p->pPars->nBTLimitNode = 0;
  if (Pars.fVerbose != 0) {
    printf("Simulating %d AIG nodes for %d cycles ... ",
           (ulong)(uint)(pManAig->nObjs[6] + pManAig->nObjs[5]),(ulong)(Pars.nFramesP + 0x20));
  }
  pAVar13 = pManAig;
  pFVar14 = Fra_SmlSimulateSeq(pManAig,Pars.nFramesP,0x20,1,1);
  iVar5 = (int)pAVar13;
  p->pSml = pFVar14;
  if (Pars.fVerbose != 0) {
    Abc_Print(iVar5,"%s =","Time");
    aVar12 = Abc_Clock();
    Abc_Print(iVar5,"%9.2f sec\n",(double)(aVar12 - aVar11) / 1000000.0);
  }
  Fra_ClassesPrepare(p->pCla,p->pPars->fLatchCorr,p->pPars->nMaxLevs);
  if (p->pPars->fUse1Hot != 0) {
    pVVar15 = Fra_OneHotCompute(p,p->pSml);
    p->vOneHots = pVVar15;
  }
  Fra_SmlStop(p->pSml);
  pFVar14 = Fra_SmlStart(pManAig,0,Pars.nFramesK + 1,Pars.nSimWords);
  p->pSml = pFVar14;
  if (Pars.fUseImps != 0) {
    pVVar15 = Fra_ImpDerive(p,5000000,Pars.nMaxImps,Pars.fLatchCorr);
    p->pCla->vImps = pVVar15;
  }
  if ((pParams->TimeLimit != 0.0) || (NAN(pParams->TimeLimit))) {
    aVar12 = Abc_Clock();
    if (local_c0 < aVar12) {
      uVar20 = 0xffffffff;
LAB_004fce1d:
      if (pParams->fSilent == 0) {
        puts("Fra_FraigInduction(): Runtime limit exceeded.");
      }
      pAVar13 = (Aig_Man_t *)0x0;
      goto LAB_004fd33f;
    }
  }
  Fra_BmcPerform(p,Pars.nFramesP,Pars.nFramesK + 1);
  iVar5 = Fra_ClassesCountLits(p->pCla);
  p->nLitsBeg = iVar5;
  p->nNodesBeg = iVar6 + iVar7;
  p->nRegsBeg = iVar10;
  pFVar22 = p->pCla;
  pFVar22->fRefinement = 1;
  uVar20 = 0;
  iVar10 = 1;
  while (iVar10 != 0) {
    iVar6 = Fra_ClassesCountLits(pFVar22);
    pVVar15 = p->pCla->vImps;
    iVar7 = 0;
    iVar10 = 0;
    if (pVVar15 != (Vec_Int_t *)0x0) {
      iVar10 = pVVar15->nSize;
    }
    if (p->vOneHots != (Vec_Int_t *)0x0) {
      iVar7 = Fra_OneHotCount(p,p->vOneHots);
    }
    aVar12 = Abc_Clock();
    if ((pParams->TimeLimit != 0.0) || (NAN(pParams->TimeLimit))) {
      aVar16 = Abc_Clock();
      if (local_c0 < aVar16) goto LAB_004fce1d;
    }
    p->pCla->fRefinement = 0;
    aVar16 = Abc_Clock();
    pAVar13 = Fra_FramesWithClasses(p);
    p->pManFraig = pAVar13;
    aVar17 = Abc_Clock();
    p->timeTrav = p->timeTrav + (aVar17 - aVar16);
    if (p->pPars->fRewrite != 0) {
      Fra_FraigInductionRewrite(p);
    }
    pAVar13 = p->pManFraig;
    if (Pars.fUseImps == 0) {
      p_00 = Cnf_Derive(pAVar13,pAVar13->nRegs);
    }
    else {
      p_00 = Cnf_DeriveSimple(pAVar13,pAVar13->nRegs);
    }
    psVar18 = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
    p->pSat = psVar18;
    p->nSatVars = p_00->nVars;
    if (psVar18 == (sat_solver *)0x0) {
      __assert_fail("p->pSat != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                    ,0x1fd,"Aig_Man_t *Fra_FraigInduction(Aig_Man_t *, Fra_Ssw_t *)");
    }
    if (Pars.fUseImps != 0) {
      Fra_ImpAddToSolver(p,p->pCla->vImps,p_00->pVarNums);
      if (p->pSat == (sat_solver *)0x0) {
        puts("Fra_FraigInduction(): Adding implicationsn to CNF led to a conflict.");
      }
    }
    iVar5 = 0;
    while( true ) {
      pVVar4 = p->pManFraig->vObjs;
      iVar2 = pVVar4->nSize;
      if (iVar2 <= iVar5) break;
      pvVar19 = Vec_PtrEntry(pVVar4,iVar5);
      if (pvVar19 != (void *)0x0) {
        *(Fra_Man_t **)((long)pvVar19 + 0x28) = p;
      }
      iVar5 = iVar5 + 1;
    }
    Fra_ManClean(p,iVar2 + p->pManAig->nObjs[5] + p->pManAig->nObjs[6]);
    for (iVar5 = 0; pVVar4 = p->pManFraig->vObjs, iVar5 < pVVar4->nSize; iVar5 = iVar5 + 1) {
      pvVar19 = Vec_PtrEntry(pVVar4,iVar5);
      if (pvVar19 != (void *)0x0) {
        if (p_00->pVarNums[*(int *)((long)pvVar19 + 0x24)] != -1) {
          *(int *)(*(long *)(*(long *)((long)pvVar19 + 0x28) + 0x98) +
                  (long)*(int *)((long)pvVar19 + 0x24) * 4) =
               p_00->pVarNums[*(int *)((long)pvVar19 + 0x24)];
          *(undefined8 *)
           (*(long *)(*(long *)((long)pvVar19 + 0x28) + 0x90) +
           (long)*(int *)((long)pvVar19 + 0x24) * 8) = 1;
        }
      }
    }
    Cnf_DataFree(p_00);
    if (p->pPars->fUse1Hot != 0) {
      Fra_OneHotAssume(p,p->vOneHots);
    }
    if (Pars.fVerbose != 0) {
      pFVar22 = p->pCla;
      uVar9 = pFVar22->vClasses1->nSize;
      uVar3 = pFVar22->vClasses->nSize;
      uVar8 = Fra_ClassesCountLits(pFVar22);
      printf("%3d : C = %6d. Cl = %6d.  L = %6d. LR = %6d.  ",(ulong)uVar20,(ulong)uVar9,
             (ulong)uVar3,(ulong)uVar8,(ulong)(uint)p->pManFraig->nAsserts);
      pVVar15 = p->pCla->vImps;
      if (pVVar15 != (Vec_Int_t *)0x0) {
        printf("I = %6d. ",(ulong)(uint)pVVar15->nSize);
      }
      if (p->pPars->fUse1Hot != 0) {
        uVar9 = Fra_OneHotCount(p,p->vOneHots);
        printf("1h = %6d. ",(ulong)uVar9);
      }
      printf("NR = %6d. ");
    }
    p->nSatCallsRecent = 0;
    p->nSatCallsSkipped = 0;
    Abc_Clock();
    if (p->pPars->fUse1Hot != 0) {
      Fra_OneHotCheck(p,p->vOneHots);
    }
    pFVar21 = p;
    Fra_FraigSweep(p);
    iVar5 = (int)pFVar21;
    if (Pars.fVerbose != 0) {
      Abc_Print(iVar5,"%s =","T");
      aVar16 = Abc_Clock();
      Abc_Print(iVar5,"%9.2f sec\n",(double)(aVar16 - aVar12) / 1000000.0);
    }
    Aig_ManStop(p->pManFraig);
    p->pManFraig = (Aig_Man_t *)0x0;
    sat_solver_delete(p->pSat);
    p->pSat = (sat_solver *)0x0;
    memset(p->pMemFraig,0,(long)p->nFramesAll * (long)p->nSizeAlloc * 8);
    if (p->vTimeouts != (Vec_Ptr_t *)0x0) {
      __assert_fail("p->vTimeouts == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                    ,0x23f,"Aig_Man_t *Fra_FraigInduction(Aig_Man_t *, Fra_Ssw_t *)");
    }
    pFVar22 = p->pCla;
    if (pFVar22->fRefinement != 0) {
      iVar5 = Fra_ClassesCountLits(pFVar22);
      pFVar22 = p->pCla;
      if (iVar6 == iVar5) {
        if (pFVar22->vImps == (Vec_Int_t *)0x0) {
          iVar6 = 0;
        }
        else {
          iVar6 = pFVar22->vImps->nSize;
        }
        if (iVar10 == iVar6) {
          if (p->vOneHots == (Vec_Int_t *)0x0) {
            iVar10 = 0;
          }
          else {
            iVar10 = Fra_OneHotCount(p,p->vOneHots);
          }
          if (iVar7 == iVar10) {
            puts("Fra_FraigInduction(): Internal error. The result may not verify.");
            break;
          }
          pFVar22 = p->pCla;
        }
      }
    }
    uVar20 = uVar20 + 1;
    iVar10 = pFVar22->fRefinement;
  }
  aVar12 = Abc_Clock();
  if ((p->pPars->fWriteImps == 0) || (p->vOneHots == (Vec_Int_t *)0x0)) {
LAB_004fd2b6:
    Fra_ClassesSelectRepr(p->pCla);
    Fra_ClassesCopyReprs(p->pCla,p->vTimeouts);
    pAVar13 = Aig_ManDupRepr(pManAig,0);
  }
  else {
    iVar10 = Fra_OneHotCount(p,p->vOneHots);
    if (iVar10 == 0) goto LAB_004fd2b6;
    pFileName = Ioa_FileNameGenericAppend(p->pManAig->pName,"_care.aig");
    printf("Care one-hotness clauses will be written into file \"%s\".\n",pFileName);
    pAVar13 = Aig_ManDupOrdered(pManAig);
    pMan = Fra_OneHotCreateExdc(p,p->vOneHots);
    Ioa_WriteAiger(pMan,pFileName,0,1);
    Aig_ManStop(pMan);
  }
  Aig_ManSeqCleanup(pAVar13);
  aVar16 = Abc_Clock();
  p->timeTrav = p->timeTrav + (aVar16 - aVar12);
  aVar12 = Abc_Clock();
  p->timeTotal = aVar12 - aVar11;
  iVar10 = Fra_ClassesCountLits(p->pCla);
  p->nLitsEnd = iVar10;
  p->nNodesEnd = pAVar13->nObjs[6] + pAVar13->nObjs[5];
  p->nRegsEnd = pAVar13->nRegs;
LAB_004fd33f:
  Fra_ManStop(p);
  pParams->nIters = uVar20;
  return pAVar13;
}

Assistant:

Aig_Man_t * Fra_FraigInduction( Aig_Man_t * pManAig, Fra_Ssw_t * pParams )
{
    int fUseSimpleCnf = 0;
    int fUseOldSimulation = 0;
    // other paramaters affecting performance
    // - presence of FRAIGing in Abc_NtkDarSeqSweep()
    // - using distance-1 patterns in Fra_SmlAssignDist1()
    // - the number of simulation patterns
    // - the number of BMC frames

    Fra_Man_t * p;
    Fra_Par_t Pars, * pPars = &Pars; 
    Aig_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    Aig_Man_t * pManAigNew = NULL;
    int nNodesBeg, nRegsBeg;
    int nIter = -1; // Suppress "might be used uninitialized"
    int i;
    abctime clk = Abc_Clock(), clk2;
    abctime TimeToStop = pParams->TimeLimit ? pParams->TimeLimit * CLOCKS_PER_SEC + Abc_Clock() : 0;

    if ( Aig_ManNodeNum(pManAig) == 0 )
    {
        pParams->nIters = 0;
        // Ntl_ManFinalize() needs the following to satisfy an assertion
        Aig_ManReprStart(pManAig,Aig_ManObjNumMax(pManAig));
        return Aig_ManDupOrdered(pManAig);
    }
    assert( Aig_ManRegNum(pManAig) > 0 );
    assert( pParams->nFramesK > 0 );
//Aig_ManShow( pManAig, 0, NULL );

    if ( pParams->fWriteImps && pParams->nPartSize > 0 )
    {
        pParams->nPartSize = 0;
        printf( "Partitioning was disabled to allow implication writing.\n" );
    }
    // perform partitioning
    if ( (pParams->nPartSize > 0 && pParams->nPartSize < Aig_ManRegNum(pManAig))
         || (pManAig->vClockDoms && Vec_VecSize(pManAig->vClockDoms) > 0)  )
        return Fra_FraigInductionPart( pManAig, pParams );
 
    nNodesBeg = Aig_ManNodeNum(pManAig);
    nRegsBeg  = Aig_ManRegNum(pManAig);

    // enhance the AIG by adding timeframes
//    Fra_FramesAddMore( pManAig, 3 );

    // get parameters
    Fra_ParamsDefaultSeq( pPars );
    pPars->nFramesP   = pParams->nFramesP;
    pPars->nFramesK   = pParams->nFramesK;
    pPars->nMaxImps   = pParams->nMaxImps;
    pPars->nMaxLevs   = pParams->nMaxLevs;
    pPars->fVerbose   = pParams->fVerbose;
    pPars->fRewrite   = pParams->fRewrite;
    pPars->fLatchCorr = pParams->fLatchCorr;
    pPars->fUseImps   = pParams->fUseImps;
    pPars->fWriteImps = pParams->fWriteImps;
    pPars->fUse1Hot   = pParams->fUse1Hot;

    assert( !(pPars->nFramesP > 0 && pPars->fUse1Hot) );
    assert( !(pPars->nFramesK > 1 && pPars->fUse1Hot) );
 
    // start the fraig manager for this run
    p = Fra_ManStart( pManAig, pPars );
    p->pPars->nBTLimitNode = 0;
    // derive and refine e-classes using K initialized frames
    if ( fUseOldSimulation )
    {
        if ( pPars->nFramesP > 0 )
        {
            pPars->nFramesP = 0;
            printf( "Fra_FraigInduction(): Prefix cannot be used.\n" );
        }
        p->pSml = Fra_SmlStart( pManAig, 0, pPars->nFramesK + 1, pPars->nSimWords );
        Fra_SmlSimulate( p, 1 );
    }
    else
    {
        // bug:  r iscas/blif/s5378.blif    ; st; ssw -v
        // bug:  r iscas/blif/s1238.blif    ; st; ssw -v
        // refine the classes with more simulation rounds
if ( pPars->fVerbose )
printf( "Simulating %d AIG nodes for %d cycles ... ", Aig_ManNodeNum(pManAig), pPars->nFramesP + 32 );
        p->pSml = Fra_SmlSimulateSeq( pManAig, pPars->nFramesP, 32, 1, 1  ); //pPars->nFramesK + 1, 1 );  
if ( pPars->fVerbose ) 
{
ABC_PRT( "Time", Abc_Clock() - clk );
}
        Fra_ClassesPrepare( p->pCla, p->pPars->fLatchCorr, p->pPars->nMaxLevs );
//        Fra_ClassesPostprocess( p->pCla );
        // compute one-hotness conditions
        if ( p->pPars->fUse1Hot )
            p->vOneHots = Fra_OneHotCompute( p, p->pSml );
        // allocate new simulation manager for simulating counter-examples
        Fra_SmlStop( p->pSml );
        p->pSml = Fra_SmlStart( pManAig, 0, pPars->nFramesK + 1, pPars->nSimWords );
    }

    // select the most expressive implications
    if ( pPars->fUseImps )
        p->pCla->vImps = Fra_ImpDerive( p, 5000000, pPars->nMaxImps, pPars->fLatchCorr );

    if ( pParams->TimeLimit != 0.0 && Abc_Clock() > TimeToStop )
    {
        if ( !pParams->fSilent )
            printf( "Fra_FraigInduction(): Runtime limit exceeded.\n" );
        goto finish;
    }

    // perform BMC (for the min number of frames)
    Fra_BmcPerform( p, pPars->nFramesP, pPars->nFramesK+1 ); // +1 is needed to prevent non-refinement
//Fra_ClassesPrint( p->pCla, 1 );
//    if ( p->vCex == NULL )
//        p->vCex = Vec_IntAlloc( 1000 );

    p->nLitsBeg  = Fra_ClassesCountLits( p->pCla );
    p->nNodesBeg = nNodesBeg; // Aig_ManNodeNum(pManAig);
    p->nRegsBeg  = nRegsBeg; // Aig_ManRegNum(pManAig);

    // dump AIG of the timeframes
//    pManAigNew = Fra_ClassesDeriveAig( p->pCla, pPars->nFramesK );
//    Aig_ManDumpBlif( pManAigNew, "frame_aig.blif", NULL, NULL );
//    Fra_ManPartitionTest2( pManAigNew );
//    Aig_ManStop( pManAigNew );
 
    // iterate the inductive case
    p->pCla->fRefinement = 1;
    for ( nIter = 0; p->pCla->fRefinement; nIter++ )
    {
        int nLitsOld = Fra_ClassesCountLits(p->pCla);
        int nImpsOld = p->pCla->vImps? Vec_IntSize(p->pCla->vImps) : 0;
        int nHotsOld = p->vOneHots? Fra_OneHotCount(p, p->vOneHots) : 0;
        abctime clk3 = Abc_Clock();

        if ( pParams->TimeLimit != 0.0 && Abc_Clock() > TimeToStop )
        {
            if ( !pParams->fSilent )
                printf( "Fra_FraigInduction(): Runtime limit exceeded.\n" );
            goto finish;
        }

        // mark the classes as non-refined
        p->pCla->fRefinement = 0;
        // derive non-init K-timeframes while implementing e-classes
clk2 = Abc_Clock();
        p->pManFraig = Fra_FramesWithClasses( p );
p->timeTrav += Abc_Clock() - clk2;
//Aig_ManDumpBlif( p->pManFraig, "testaig.blif", NULL, NULL );

        // perform AIG rewriting
        if ( p->pPars->fRewrite )
            Fra_FraigInductionRewrite( p );

        // convert the manager to SAT solver (the last nLatches outputs are inputs)
        if ( fUseSimpleCnf || pPars->fUseImps )
            pCnf = Cnf_DeriveSimple( p->pManFraig, Aig_ManRegNum(p->pManFraig) );
        else
            pCnf = Cnf_Derive( p->pManFraig, Aig_ManRegNum(p->pManFraig) );
//        Cnf_DataTranformPolarity( pCnf, 0 );
//Cnf_DataWriteIntoFile( pCnf, "temp.cnf", 1 );

        p->pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
        p->nSatVars = pCnf->nVars;
        assert( p->pSat != NULL );
        if ( p->pSat == NULL )
            printf( "Fra_FraigInduction(): Computed CNF is not valid.\n" );
        if ( pPars->fUseImps )
        {
            Fra_ImpAddToSolver( p, p->pCla->vImps, pCnf->pVarNums );
            if ( p->pSat == NULL )
                printf( "Fra_FraigInduction(): Adding implicationsn to CNF led to a conflict.\n" );
        }

        // set the pointers to the manager
        Aig_ManForEachObj( p->pManFraig, pObj, i )
            pObj->pData = p;

        // prepare solver for fraiging the last timeframe
        Fra_ManClean( p, Aig_ManObjNumMax(p->pManFraig) + Aig_ManNodeNum(p->pManAig) );

        // transfer PI/LO variable numbers
        Aig_ManForEachObj( p->pManFraig, pObj, i )
        {
            if ( pCnf->pVarNums[pObj->Id] == -1 )
                continue;
            Fra_ObjSetSatNum( pObj, pCnf->pVarNums[pObj->Id] );
            Fra_ObjSetFaninVec( pObj, (Vec_Ptr_t *)1 );
        }
        Cnf_DataFree( pCnf );

        // add one-hotness clauses
        if ( p->pPars->fUse1Hot )
            Fra_OneHotAssume( p, p->vOneHots );
//        if ( p->pManAig->vOnehots )
//            Fra_OneHotAddKnownConstraint( p, p->pManAig->vOnehots );
 
        // report the intermediate results
        if ( pPars->fVerbose )
        {
            printf( "%3d : C = %6d. Cl = %6d.  L = %6d. LR = %6d.  ", 
                nIter, Vec_PtrSize(p->pCla->vClasses1), Vec_PtrSize(p->pCla->vClasses), 
                Fra_ClassesCountLits(p->pCla), p->pManFraig->nAsserts );
            if ( p->pCla->vImps )
                printf( "I = %6d. ", Vec_IntSize(p->pCla->vImps) );
            if ( p->pPars->fUse1Hot )
                printf( "1h = %6d. ", Fra_OneHotCount(p, p->vOneHots) );
            printf( "NR = %6d. ", Aig_ManNodeNum(p->pManFraig) );
//            printf( "\n" );
        } 

        // perform sweeping
        p->nSatCallsRecent = 0;
        p->nSatCallsSkipped = 0;
clk2 = Abc_Clock();
        if ( p->pPars->fUse1Hot )
            Fra_OneHotCheck( p, p->vOneHots );
        Fra_FraigSweep( p );
        if ( pPars->fVerbose )
        {
            ABC_PRT( "T", Abc_Clock() - clk3 );
        } 

//        Sat_SolverPrintStats( stdout, p->pSat );
        // remove FRAIG and SAT solver
        Aig_ManStop( p->pManFraig );   p->pManFraig = NULL;
//        printf( "Vars = %d. Clauses = %d. Learnts = %d.\n", p->pSat->size, p->pSat->clauses.size, p->pSat->learnts.size );
        sat_solver_delete( p->pSat );  p->pSat = NULL; 
        memset( p->pMemFraig, 0, sizeof(Aig_Obj_t *) * p->nSizeAlloc * p->nFramesAll );
//        printf( "Recent SAT called = %d. Skipped = %d.\n", p->nSatCallsRecent, p->nSatCallsSkipped );
        assert( p->vTimeouts == NULL );
        if ( p->vTimeouts )
           printf( "Fra_FraigInduction(): SAT solver timed out!\n" );
        // check if refinement has happened
//        p->pCla->fRefinement = (int)(nLitsOld != Fra_ClassesCountLits(p->pCla));
        if ( p->pCla->fRefinement && 
            nLitsOld == Fra_ClassesCountLits(p->pCla) && 
            nImpsOld == (p->pCla->vImps? Vec_IntSize(p->pCla->vImps) : 0) && 
            nHotsOld == (p->vOneHots? Fra_OneHotCount(p, p->vOneHots) : 0) )
        {
            printf( "Fra_FraigInduction(): Internal error. The result may not verify.\n" );
            break;
        }
    }
/*
    // verify implications using simulation
    if ( p->pCla->vImps && Vec_IntSize(p->pCla->vImps) )
    {
        int Temp;
        abctime clk = Abc_Clock();
        if ( Temp = Fra_ImpVerifyUsingSimulation( p ) )
            printf( "Implications failing the simulation test = %d (out of %d).  ", Temp, Vec_IntSize(p->pCla->vImps) );
        else
            printf( "All %d implications have passed the simulation test.  ", Vec_IntSize(p->pCla->vImps) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
*/

    // move the classes into representatives and reduce AIG
clk2 = Abc_Clock();
    if ( p->pPars->fWriteImps && p->vOneHots && Fra_OneHotCount(p, p->vOneHots) )
    {
        extern void Ioa_WriteAiger( Aig_Man_t * pMan, char * pFileName, int fWriteSymbols, int fCompact );
        Aig_Man_t * pNew;
        char * pFileName = Ioa_FileNameGenericAppend( p->pManAig->pName, "_care.aig" );
        printf( "Care one-hotness clauses will be written into file \"%s\".\n", pFileName );
        pManAigNew = Aig_ManDupOrdered( pManAig );
        pNew = Fra_OneHotCreateExdc( p, p->vOneHots );
        Ioa_WriteAiger( pNew, pFileName, 0, 1 );
        Aig_ManStop( pNew );
    }
    else 
    {
    //    Fra_ClassesPrint( p->pCla, 1 );
        Fra_ClassesSelectRepr( p->pCla );
        Fra_ClassesCopyReprs( p->pCla, p->vTimeouts );
        pManAigNew = Aig_ManDupRepr( pManAig, 0 );
    }
    // add implications to the manager
//    if ( fWriteImps && p->pCla->vImps && Vec_IntSize(p->pCla->vImps) )
//        Fra_ImpRecordInManager( p, pManAigNew );
    // cleanup the new manager
    Aig_ManSeqCleanup( pManAigNew );
    // remove pointers to the dead nodes
//    Aig_ManForEachObj( pManAig, pObj, i )
//        if ( pObj->pData && Aig_ObjIsNone(pObj->pData) )
//            pObj->pData = NULL;
//    Aig_ManCountMergeRegs( pManAigNew );
p->timeTrav += Abc_Clock() - clk2;
p->timeTotal = Abc_Clock() - clk;
    // get the final stats
    p->nLitsEnd  = Fra_ClassesCountLits( p->pCla );
    p->nNodesEnd = Aig_ManNodeNum(pManAigNew);
    p->nRegsEnd  = Aig_ManRegNum(pManAigNew);
    // free the manager
finish:
    Fra_ManStop( p );
    // check the output
//    if ( Aig_ManCoNum(pManAigNew) - Aig_ManRegNum(pManAigNew) == 1 )
//        if ( Aig_ObjChild0( Aig_ManCo(pManAigNew,0) ) == Aig_ManConst0(pManAigNew) )
//            printf( "Proved output constant 0.\n" );
    pParams->nIters = nIter;
    return pManAigNew;
}